

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519-donna-impl-base.h
# Opt level: O0

void ge25519_pack(uchar *r,ge25519 *p)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  ulong uVar109;
  ulong uVar110;
  ulong uVar111;
  ulong uVar112;
  ulong uVar113;
  ulong uVar114;
  ulong uVar115;
  ulong uVar116;
  ulong uVar117;
  ulong uVar118;
  char local_2e8 [8];
  uchar parity [32];
  bignum25519 zi;
  bignum25519 ty;
  bignum25519 tx;
  ge25519 *p_local;
  uchar *r_local;
  uint64_t c_1;
  uint64_t s4_1;
  uint64_t s3_1;
  uint64_t s2_1;
  uint64_t s1_1;
  uint64_t s0_1;
  uint64_t r4_1;
  uint64_t r3_1;
  uint64_t r2_1;
  uint64_t r1_1;
  uint64_t r0_1;
  uint128_t t_1 [5];
  uint64_t c;
  uint64_t s4;
  uint64_t s3;
  uint64_t s2;
  uint64_t s1;
  uint64_t s0;
  uint64_t r4;
  uint64_t r3;
  uint64_t r2;
  uint64_t r1;
  uint64_t r0;
  uint128_t t [5];
  ulong local_a8;
  uint64_t i_1;
  uint64_t f_1;
  uint64_t t_3 [5];
  char *local_60;
  ulong local_58;
  uint64_t i;
  uint64_t f;
  uint64_t t_2 [5];
  uchar *local_10;
  
  curve25519_recip((uint64_t *)(parity + 0x18),p->z);
  uVar110 = p->x[0];
  uVar115 = p->x[1];
  uVar112 = p->x[2];
  uVar113 = p->x[3];
  uVar114 = p->x[4];
  auVar1._8_8_ = 0;
  auVar1[0] = parity[0x18];
  auVar1[1] = parity[0x19];
  auVar1[2] = parity[0x1a];
  auVar1[3] = parity[0x1b];
  auVar1[4] = parity[0x1c];
  auVar1[5] = parity[0x1d];
  auVar1[6] = parity[0x1e];
  auVar1[7] = parity[0x1f];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar110;
  auVar2._8_8_ = 0;
  auVar2[0] = parity[0x18];
  auVar2[1] = parity[0x19];
  auVar2[2] = parity[0x1a];
  auVar2[3] = parity[0x1b];
  auVar2[4] = parity[0x1c];
  auVar2[5] = parity[0x1d];
  auVar2[6] = parity[0x1e];
  auVar2[7] = parity[0x1f];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar115;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = zi[0];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar110;
  auVar4._8_8_ = 0;
  auVar4[0] = parity[0x18];
  auVar4[1] = parity[0x19];
  auVar4[2] = parity[0x1a];
  auVar4[3] = parity[0x1b];
  auVar4[4] = parity[0x1c];
  auVar4[5] = parity[0x1d];
  auVar4[6] = parity[0x1e];
  auVar4[7] = parity[0x1f];
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar112;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = zi[1];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar110;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = zi[0];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar115;
  auVar7._8_8_ = 0;
  auVar7[0] = parity[0x18];
  auVar7[1] = parity[0x19];
  auVar7[2] = parity[0x1a];
  auVar7[3] = parity[0x1b];
  auVar7[4] = parity[0x1c];
  auVar7[5] = parity[0x1d];
  auVar7[6] = parity[0x1e];
  auVar7[7] = parity[0x1f];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar113;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = zi[2];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar110;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = zi[0];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar112;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = zi[1];
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar115;
  auVar11._8_8_ = 0;
  auVar11[0] = parity[0x18];
  auVar11[1] = parity[0x19];
  auVar11[2] = parity[0x1a];
  auVar11[3] = parity[0x1b];
  auVar11[4] = parity[0x1c];
  auVar11[5] = parity[0x1d];
  auVar11[6] = parity[0x1e];
  auVar11[7] = parity[0x1f];
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar114;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = zi[3];
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar110;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = zi[2];
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar115;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = zi[0];
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar113;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = zi[1];
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar112;
  uVar110 = zi[2] * 0x13;
  uVar109 = zi[3] * 0x13;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar109;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar115;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = zi[0] * 0x13;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar114;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = zi[1] * 0x13;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar113;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar110;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar112;
  auVar1 = auVar19 * auVar69 + auVar18 * auVar68 + auVar17 * auVar67 + auVar16 * auVar66 +
           auVar1 * auVar51;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar109;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar112;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = zi[1] * 0x13;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar114;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar110;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar113;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar109;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar113;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar110;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar114;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar109;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar114;
  r0 = auVar1._0_8_;
  t[0]._0_8_ = auVar1._8_8_;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = (long)t[0] << 0xd | r0 >> 0x33;
  auVar101 = auVar22 * auVar72 + auVar21 * auVar71 + auVar20 * auVar70 +
             auVar3 * auVar53 + auVar2 * auVar52 + auVar101;
  uVar115 = auVar101._0_8_;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = auVar101._8_8_ << 0xd | uVar115 >> 0x33;
  auVar102 = auVar24 * auVar74 + auVar23 * auVar73 +
             auVar6 * auVar56 + auVar5 * auVar55 + auVar4 * auVar54 + auVar102;
  uVar116 = auVar102._0_8_;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = auVar102._8_8_ << 0xd | uVar116 >> 0x33;
  auVar103 = auVar25 * auVar75 +
             auVar10 * auVar60 + auVar9 * auVar59 + auVar8 * auVar58 + auVar7 * auVar57 + auVar103;
  uVar117 = auVar103._0_8_;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = auVar103._8_8_ << 0xd | uVar117 >> 0x33;
  auVar104 = auVar15 * auVar65 +
             auVar14 * auVar64 + auVar13 * auVar63 + auVar12 * auVar62 + auVar11 * auVar61 +
             auVar104;
  uVar118 = auVar104._0_8_;
  uVar110 = (r0 & 0x7ffffffffffff) + (auVar104._8_8_ << 0xd | uVar118 >> 0x33) * 0x13;
  r1 = uVar110 & 0x7ffffffffffff;
  uVar111 = (uVar115 & 0x7ffffffffffff) + (uVar110 >> 0x33);
  uVar110 = p->y[0];
  uVar115 = p->y[1];
  uVar112 = p->y[2];
  uVar113 = p->y[3];
  uVar114 = p->y[4];
  auVar26._8_8_ = 0;
  auVar26[0] = parity[0x18];
  auVar26[1] = parity[0x19];
  auVar26[2] = parity[0x1a];
  auVar26[3] = parity[0x1b];
  auVar26[4] = parity[0x1c];
  auVar26[5] = parity[0x1d];
  auVar26[6] = parity[0x1e];
  auVar26[7] = parity[0x1f];
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar110;
  auVar27._8_8_ = 0;
  auVar27[0] = parity[0x18];
  auVar27[1] = parity[0x19];
  auVar27[2] = parity[0x1a];
  auVar27[3] = parity[0x1b];
  auVar27[4] = parity[0x1c];
  auVar27[5] = parity[0x1d];
  auVar27[6] = parity[0x1e];
  auVar27[7] = parity[0x1f];
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar115;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = zi[0];
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uVar110;
  auVar29._8_8_ = 0;
  auVar29[0] = parity[0x18];
  auVar29[1] = parity[0x19];
  auVar29[2] = parity[0x1a];
  auVar29[3] = parity[0x1b];
  auVar29[4] = parity[0x1c];
  auVar29[5] = parity[0x1d];
  auVar29[6] = parity[0x1e];
  auVar29[7] = parity[0x1f];
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar112;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = zi[1];
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar110;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = zi[0];
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar115;
  auVar32._8_8_ = 0;
  auVar32[0] = parity[0x18];
  auVar32[1] = parity[0x19];
  auVar32[2] = parity[0x1a];
  auVar32[3] = parity[0x1b];
  auVar32[4] = parity[0x1c];
  auVar32[5] = parity[0x1d];
  auVar32[6] = parity[0x1e];
  auVar32[7] = parity[0x1f];
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar113;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = zi[2];
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar110;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = zi[0];
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar112;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = zi[1];
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar115;
  auVar36._8_8_ = 0;
  auVar36[0] = parity[0x18];
  auVar36[1] = parity[0x19];
  auVar36[2] = parity[0x1a];
  auVar36[3] = parity[0x1b];
  auVar36[4] = parity[0x1c];
  auVar36[5] = parity[0x1d];
  auVar36[6] = parity[0x1e];
  auVar36[7] = parity[0x1f];
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar114;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = zi[3];
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar110;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = zi[2];
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar115;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = zi[0];
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar113;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = zi[1];
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar112;
  uVar110 = zi[2] * 0x13;
  uVar109 = zi[3] * 0x13;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar109;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar115;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = zi[0] * 0x13;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar114;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = zi[1] * 0x13;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar113;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar110;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar112;
  auVar1 = auVar42 * auVar92 + auVar41 * auVar91 + auVar43 * auVar93 + auVar44 * auVar94 +
           auVar26 * auVar76;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar109;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar112;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = zi[1] * 0x13;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar114;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar110;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar113;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar109;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar113;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar110;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar114;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar109;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar114;
  r0_1 = auVar1._0_8_;
  t_1[0]._0_8_ = auVar1._8_8_;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = (long)t_1[0] << 0xd | r0_1 >> 0x33;
  auVar105 = auVar46 * auVar96 + auVar45 * auVar95 + auVar47 * auVar97 +
             auVar28 * auVar78 + auVar27 * auVar77 + auVar105;
  uVar115 = auVar105._0_8_;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = auVar105._8_8_ << 0xd | uVar115 >> 0x33;
  auVar106 = auVar49 * auVar99 + auVar48 * auVar98 +
             auVar31 * auVar81 + auVar30 * auVar80 + auVar29 * auVar79 + auVar106;
  uVar112 = auVar106._0_8_;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = auVar106._8_8_ << 0xd | uVar112 >> 0x33;
  auVar107 = auVar50 * auVar100 +
             auVar35 * auVar85 + auVar34 * auVar84 + auVar33 * auVar83 + auVar32 * auVar82 +
             auVar107;
  uVar113 = auVar107._0_8_;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = auVar107._8_8_ << 0xd | uVar113 >> 0x33;
  auVar108 = auVar40 * auVar90 +
             auVar39 * auVar89 + auVar38 * auVar88 + auVar37 * auVar87 + auVar36 * auVar86 +
             auVar108;
  uVar114 = auVar108._0_8_;
  uVar110 = (auVar108._8_8_ << 0xd | uVar114 >> 0x33) * 0x13 + (r0_1 & 0x7ffffffffffff);
  uVar115 = (uVar110 >> 0x33) + (uVar115 & 0x7ffffffffffff);
  uVar112 = (uVar115 >> 0x33) + (uVar112 & 0x7ffffffffffff);
  uVar113 = (uVar112 >> 0x33) + (uVar113 & 0x7ffffffffffff);
  uVar114 = (uVar113 >> 0x33) + (uVar114 & 0x7ffffffffffff);
  uVar110 = (uVar114 >> 0x33) * 0x13 + (uVar110 & 0x7ffffffffffff);
  uVar115 = (uVar110 >> 0x33) + (uVar115 & 0x7ffffffffffff);
  uVar112 = (uVar115 >> 0x33) + (uVar112 & 0x7ffffffffffff);
  uVar113 = (uVar112 >> 0x33) + (uVar113 & 0x7ffffffffffff);
  uVar114 = (uVar113 >> 0x33) + (uVar114 & 0x7ffffffffffff);
  uVar110 = (uVar114 >> 0x33) * 0x13 + (uVar110 & 0x7ffffffffffff) + 0x13;
  uVar115 = (uVar110 >> 0x33) + (uVar115 & 0x7ffffffffffff);
  uVar112 = (uVar115 >> 0x33) + (uVar112 & 0x7ffffffffffff);
  uVar113 = (uVar112 >> 0x33) + (uVar113 & 0x7ffffffffffff);
  uVar114 = (uVar113 >> 0x33) + (uVar114 & 0x7ffffffffffff);
  uVar110 = (uVar114 >> 0x33) * 0x13 + (uVar110 & 0x7ffffffffffff) + 0x7ffffffffffed;
  uVar115 = (uVar110 >> 0x33) + (uVar115 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar109 = (uVar115 >> 0x33) + (uVar112 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar115 = uVar115 & 0x7ffffffffffff;
  uVar112 = (uVar109 >> 0x33) + (uVar113 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar109 = uVar109 & 0x7ffffffffffff;
  uVar113 = uVar112 & 0x7ffffffffffff;
  i = uVar110 & 0x7ffffffffffff | uVar115 << 0x33;
  local_10 = r;
  for (local_58 = 0; local_58 < 8; local_58 = local_58 + 1) {
    *local_10 = (uchar)i;
    i = i >> 8;
    local_10 = local_10 + 1;
  }
  i = uVar115 >> 0xd | uVar109 << 0x26;
  for (local_58 = 0; local_58 < 8; local_58 = local_58 + 1) {
    *local_10 = (uchar)i;
    i = i >> 8;
    local_10 = local_10 + 1;
  }
  i = uVar109 >> 0x1a | uVar113 << 0x19;
  for (local_58 = 0; local_58 < 8; local_58 = local_58 + 1) {
    *local_10 = (uchar)i;
    i = i >> 8;
    local_10 = local_10 + 1;
  }
  i = uVar113 >> 0x27 |
      ((uVar112 >> 0x33) + (uVar114 & 0x7ffffffffffff) + 0x7ffffffffffff & 0x7ffffffffffff) << 0xc;
  for (local_58 = 0; local_58 < 8; local_58 = local_58 + 1) {
    *local_10 = (uchar)i;
    i = i >> 8;
    local_10 = local_10 + 1;
  }
  uVar110 = (uVar111 >> 0x33) + (uVar116 & 0x7ffffffffffff);
  uVar115 = (uVar110 >> 0x33) + (uVar117 & 0x7ffffffffffff);
  uVar112 = (uVar115 >> 0x33) + (uVar118 & 0x7ffffffffffff);
  uVar113 = (uVar112 >> 0x33) * 0x13 + r1;
  uVar114 = (uVar113 >> 0x33) + (uVar111 & 0x7ffffffffffff);
  uVar110 = (uVar114 >> 0x33) + (uVar110 & 0x7ffffffffffff);
  uVar110 = (uVar110 >> 0x33) + (uVar115 & 0x7ffffffffffff);
  uVar110 = (uVar110 >> 0x33) + (uVar112 & 0x7ffffffffffff);
  uVar110 = (uVar110 >> 0x33) * 0x13 + (uVar113 & 0x7ffffffffffff) + 0x13;
  uVar110 = (uVar110 >> 0x33) + (uVar114 & 0x7ffffffffffff);
  uVar110 = (uVar110 >> 0x33) + (uVar110 & 0x7ffffffffffff);
  uVar110 = (uVar110 >> 0x33) + (uVar110 & 0x7ffffffffffff);
  uVar110 = (uVar110 >> 0x33) + (uVar110 & 0x7ffffffffffff);
  uVar110 = (uVar110 >> 0x33) * 0x13 + (uVar110 & 0x7ffffffffffff) + 0x7ffffffffffed;
  uVar115 = (uVar110 >> 0x33) + (uVar110 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar113 = (uVar115 >> 0x33) + (uVar110 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar115 = uVar115 & 0x7ffffffffffff;
  uVar112 = (uVar113 >> 0x33) + (uVar110 & 0x7ffffffffffff) + 0x7ffffffffffff;
  uVar113 = uVar113 & 0x7ffffffffffff;
  uVar114 = uVar112 & 0x7ffffffffffff;
  i_1 = uVar110 & 0x7ffffffffffff | uVar115 << 0x33;
  local_60 = local_2e8;
  for (local_a8 = 0; local_a8 < 8; local_a8 = local_a8 + 1) {
    *local_60 = (char)i_1;
    i_1 = i_1 >> 8;
    local_60 = local_60 + 1;
  }
  i_1 = uVar115 >> 0xd | uVar113 << 0x26;
  for (local_a8 = 0; local_a8 < 8; local_a8 = local_a8 + 1) {
    *local_60 = (char)i_1;
    i_1 = i_1 >> 8;
    local_60 = local_60 + 1;
  }
  i_1 = uVar113 >> 0x1a | uVar114 << 0x19;
  for (local_a8 = 0; local_a8 < 8; local_a8 = local_a8 + 1) {
    *local_60 = (char)i_1;
    i_1 = i_1 >> 8;
    local_60 = local_60 + 1;
  }
  i_1 = uVar114 >> 0x27 |
        ((uVar112 >> 0x33) + (uVar110 & 0x7ffffffffffff) + 0x7ffffffffffff & 0x7ffffffffffff) << 0xc
  ;
  for (local_a8 = 0; local_a8 < 8; local_a8 = local_a8 + 1) {
    *local_60 = (char)i_1;
    i_1 = i_1 >> 8;
    local_60 = local_60 + 1;
  }
  r[0x1f] = r[0x1f] ^ local_2e8[0] << 7;
  return;
}

Assistant:

static void
ge25519_pack(unsigned char r[32], const ge25519 *p) {
	bignum25519 tx, ty, zi;
	unsigned char parity[32];
	curve25519_recip(zi, p->z);
	curve25519_mul(tx, p->x, zi);
	curve25519_mul(ty, p->y, zi);
	curve25519_contract(r, ty);
	curve25519_contract(parity, tx);
	r[31] ^= ((parity[0] & 1) << 7);
}